

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O0

void __thiscall
glslang::TBuiltIns::addTabledBuiltins
          (TBuiltIns *this,int version,EProfile profile,SpvVersion *spvVersion)

{
  span<const_glslang::(anonymous_namespace)::BuiltInFunction> local_68;
  span<const_glslang::(anonymous_namespace)::BuiltInFunction> local_58;
  span<const_glslang::(anonymous_namespace)::BuiltInFunction> local_48;
  undefined1 local_38 [8];
  anon_class_24_3_9116b085 forEachFunction;
  SpvVersion *spvVersion_local;
  EProfile profile_local;
  int version_local;
  TBuiltIns *this_local;
  
  local_38 = (undefined1  [8])((long)&spvVersion_local + 4);
  forEachFunction.version = (int *)&spvVersion_local;
  forEachFunction.profile = &spvVersion->spv;
  forEachFunction.spvVersion = spvVersion;
  spvVersion_local._0_4_ = profile;
  spvVersion_local._4_4_ = version;
  _profile_local = this;
  span<glslang::(anonymous_namespace)::BuiltInFunction_const>::
  span<std::array<glslang::(anonymous_namespace)::BuiltInFunction,79ul>const>
            ((span<glslang::(anonymous_namespace)::BuiltInFunction_const> *)&local_48,
             (array<glslang::(anonymous_namespace)::BuiltInFunction,_79UL> *)
             (anonymous_namespace)::BaseFunctions);
  addTabledBuiltins::anon_class_24_3_9116b085::operator()
            ((anon_class_24_3_9116b085 *)local_38,&(this->super_TBuiltInParseables).commonBuiltins,
             &local_48);
  span<glslang::(anonymous_namespace)::BuiltInFunction_const>::
  span<std::array<glslang::(anonymous_namespace)::BuiltInFunction,3ul>const>
            ((span<glslang::(anonymous_namespace)::BuiltInFunction_const> *)&local_58,
             (array<glslang::(anonymous_namespace)::BuiltInFunction,_3UL> *)
             (anonymous_namespace)::DerivativeFunctions);
  addTabledBuiltins::anon_class_24_3_9116b085::operator()
            ((anon_class_24_3_9116b085 *)local_38,(this->super_TBuiltInParseables).stageBuiltins + 4
             ,&local_58);
  if ((((EProfile)spvVersion_local == EEsProfile) && (0x13f < spvVersion_local._4_4_)) ||
     (((EProfile)spvVersion_local != EEsProfile && (0x1c1 < spvVersion_local._4_4_)))) {
    span<glslang::(anonymous_namespace)::BuiltInFunction_const>::
    span<std::array<glslang::(anonymous_namespace)::BuiltInFunction,3ul>const>
              ((span<glslang::(anonymous_namespace)::BuiltInFunction_const> *)&local_68,
               (array<glslang::(anonymous_namespace)::BuiltInFunction,_3UL> *)
               (anonymous_namespace)::DerivativeFunctions);
    addTabledBuiltins::anon_class_24_3_9116b085::operator()
              ((anon_class_24_3_9116b085 *)local_38,
               (this->super_TBuiltInParseables).stageBuiltins + 5,&local_68);
  }
  return;
}

Assistant:

void TBuiltIns::addTabledBuiltins(int version, EProfile profile, const SpvVersion& spvVersion)
{
    const auto forEachFunction = [&](TString& decls, const span<const BuiltInFunction>& functions) {
        for (const auto& fn : functions) {
            if (ValidVersion(fn, version, profile, spvVersion))
                AddTabledBuiltin(decls, fn);
        }
    };

    forEachFunction(commonBuiltins, BaseFunctions);
    forEachFunction(stageBuiltins[EShLangFragment], DerivativeFunctions);

    if ((profile == EEsProfile && version >= 320) || (profile != EEsProfile && version >= 450))
        forEachFunction(stageBuiltins[EShLangCompute], DerivativeFunctions);
}